

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

ImVector<unsigned_short> * __thiscall
ImVector<unsigned_short>::operator=(ImVector<unsigned_short> *this,ImVector<unsigned_short> *src)

{
  int iVar1;
  int iVar2;
  unsigned_short *__dest;
  int iVar3;
  
  if (this->Data != (unsigned_short *)0x0) {
    this->Size = 0;
    this->Capacity = 0;
    ImGui::MemFree(this->Data);
    this->Data = (unsigned_short *)0x0;
  }
  iVar1 = src->Size;
  iVar2 = this->Capacity;
  if (iVar2 < iVar1) {
    if (iVar2 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar2 / 2 + iVar2;
    }
    if (iVar3 <= iVar1) {
      iVar3 = iVar1;
    }
    if (iVar2 < iVar3) {
      __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar3 * 2);
      if (this->Data != (unsigned_short *)0x0) {
        memcpy(__dest,this->Data,(long)this->Size * 2);
        ImGui::MemFree(this->Data);
      }
      this->Data = __dest;
      this->Capacity = iVar3;
    }
  }
  this->Size = iVar1;
  if (src->Data != (unsigned_short *)0x0) {
    memcpy(this->Data,src->Data,(long)iVar1 * 2);
  }
  return this;
}

Assistant:

inline ImVector<T>& operator=(const ImVector<T>& src)   { clear(); resize(src.Size); if (src.Data) memcpy(Data, src.Data, (size_t)Size * sizeof(T)); return *this; }